

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestSkipInternal::Run(TestSkipInternal *this)

{
  Outputter *pOVar1;
  string *psVar2;
  char (*s) [13];
  int local_60;
  undefined1 local_59 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_50;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_48;
  testinator local_30 [32];
  TestSkipInternal *local_10;
  TestSkipInternal *this_local;
  
  pOVar1 = (this->super_Test).m_op;
  local_10 = this;
  psVar2 = testinator::Test::GetName_abi_cxx11_(&this->super_Test);
  local_59[0] = 0;
  local_50 = testinator::operator<<
                       ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_59,
                        (Cons<testinator::Nil> *)"Hello world ",s);
  local_60 = 0x2a;
  testinator::operator<<
            (&local_48,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_59 + 1),&local_60);
  testinator::Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,int>>>
            (local_30,&local_48);
  (*pOVar1->_vptr_Outputter[1])(pOVar1,psVar2,local_30);
  std::__cxx11::string::~string((string *)local_30);
  (this->super_Test).m_skipped = true;
  return false;
}

Assistant:

virtual bool Run()
  {
    SKIP("Hello world " << 42);
    return false;
  }